

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillArea::~IfcAnnotationFillArea(IfcAnnotationFillArea *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].InnerBoundaries.have = &PTR__IfcAnnotationFillArea_009a7638;
  (this->InnerBoundaries).ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__IfcAnnotationFillArea_009a76b0;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcAnnotationFillArea_009a7660;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcAnnotationFillArea_009a7688;
  pvVar1 = *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x18;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcGeometricRepresentationItem).field_0x28 -
                           (long)pvVar1);
  }
  operator_delete(&this[-1].InnerBoundaries.have,0x70);
  return;
}

Assistant:

IfcAnnotationFillArea() : Object("IfcAnnotationFillArea") {}